

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O2

void __thiscall IniProcessing::setValue(IniProcessing *this,char *key,char *value)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,value,&local_39);
  writeIniParam(this,key,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void IniProcessing::setValue(const char *key, const char *value)
{
    writeIniParam(key, value);
}